

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.cpp
# Opt level: O1

bool __thiscall
slang::ast::SystemSubroutine::checkArgCount
          (SystemSubroutine *this,ASTContext *context,bool isMethod,Args *args,SourceRange callRange
          ,size_t min,size_t max)

{
  size_type sVar1;
  pointer ppEVar2;
  ulong uVar3;
  bool bVar4;
  Diagnostic *pDVar5;
  SourceLocation SVar6;
  long lVar8;
  DiagCode code;
  ulong uVar9;
  Args *__range2;
  bool bVar10;
  SourceRange sourceRange;
  size_t local_58;
  ASTContext *local_50;
  SystemSubroutine *local_48;
  SourceLocation local_40;
  SourceLocation local_38;
  SourceLocation SVar7;
  
  local_38 = callRange.endLoc;
  local_40 = callRange.startLoc;
  sVar1 = args->size_;
  bVar10 = sVar1 == 0;
  local_50 = context;
  local_48 = this;
  if (!bVar10) {
    ppEVar2 = args->data_;
    bVar4 = Expression::bad(*ppEVar2);
    if (!bVar4) {
      lVar8 = 8;
      do {
        bVar10 = sVar1 << 3 == lVar8;
        if (bVar10) goto LAB_003c9fc7;
        bVar4 = Expression::bad(*(Expression **)((long)ppEVar2 + lVar8));
        lVar8 = lVar8 + 8;
      } while (!bVar4);
    }
    if (!bVar10) {
      return false;
    }
  }
LAB_003c9fc7:
  uVar3 = args->size_;
  uVar9 = uVar3;
  if (isMethod) {
    if (uVar3 == 0) {
      assert::assertFailed
                ("provided",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/SystemSubroutine.cpp"
                 ,0x2f,
                 "bool slang::ast::SystemSubroutine::checkArgCount(const ASTContext &, bool, const Args &, SourceRange, size_t, size_t) const"
                );
    }
    uVar9 = uVar3 - 1;
  }
  if (uVar9 < min) {
    code.subsystem = Expressions;
    code.code = 0x8c;
    SVar6 = local_38;
    SVar7 = local_40;
  }
  else {
    if (uVar9 <= max) {
      return true;
    }
    if (uVar3 <= max) {
      std::terminate();
    }
    SVar7 = (args->data_[max]->sourceRange).startLoc;
    SVar6 = (args->data_[max]->sourceRange).endLoc;
    code.subsystem = Expressions;
    code.code = 0x8d;
    min = max;
  }
  sourceRange.endLoc = SVar6;
  sourceRange.startLoc = SVar7;
  pDVar5 = ASTContext::addDiag(local_50,code,sourceRange);
  pDVar5 = Diagnostic::operator<<(pDVar5,&local_48->name);
  local_58 = min;
  std::
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
  ::emplace_back<unsigned_long>(&pDVar5->args,&local_58);
  local_58 = uVar9;
  std::
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
  ::emplace_back<unsigned_long>(&pDVar5->args,&local_58);
  return false;
}

Assistant:

bool SystemSubroutine::checkArgCount(const ASTContext& context, bool isMethod, const Args& args,
                                     SourceRange callRange, size_t min, size_t max) const {
    for (auto arg : args) {
        if (arg->bad())
            return false;
    }

    size_t provided = args.size();
    if (isMethod) {
        ASSERT(provided);
        provided--;
    }

    if (provided < min) {
        context.addDiag(diag::TooFewArguments, callRange) << name << min << provided;
        return false;
    }

    if (provided > max) {
        context.addDiag(diag::TooManyArguments, args[max]->sourceRange) << name << max << provided;
        return false;
    }

    return true;
}